

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_59::InMemoryFile::WritableFileMappingImpl::changed
          (WritableFileMappingImpl *this,ArrayPtr<unsigned_char> slice)

{
  InMemoryFile *pIVar1;
  Impl *this_00;
  undefined1 local_30 [24];
  WritableFileMappingImpl *this_local;
  ArrayPtr<unsigned_char> slice_local;
  
  slice_local.ptr = (uchar *)slice.size_;
  this_local = (WritableFileMappingImpl *)slice.ptr;
  local_30._16_8_ = this;
  pIVar1 = Own<const_kj::(anonymous_namespace)::InMemoryFile,_std::nullptr_t>::operator->
                     (&this->ref);
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30,&pIVar1->impl);
  this_00 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                      ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
  InMemoryFile::Impl::modified(this_00);
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_30);
  return;
}

Assistant:

void changed(ArrayPtr<byte> slice) const override {
      ref->impl.lockExclusive()->modified();
    }